

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall kratos::FSM::output_table(FSM *this,string *filename)

{
  string local_238;
  undefined1 local_218 [8];
  ofstream stream;
  string *filename_local;
  FSM *this_local;
  
  std::ofstream::ofstream(local_218,(string *)filename,_S_out);
  output_table_abi_cxx11_(&local_238,this);
  std::operator<<((ostream *)local_218,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void FSM::output_table(const std::string& filename) {
    std::ofstream stream(filename);
    stream << output_table();
    stream.close();
}